

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu-aarch64.cpp
# Opt level: O1

void ggml_backend_cpu_aarch64_buffer_set_tensor
               (ggml_backend_buffer_t buffer,ggml_tensor *tensor,void *data,size_t offset,
               size_t size)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  undefined8 uVar4;
  
  if (offset == 0) {
    sVar2 = ggml_nbytes(tensor);
    if (sVar2 == size) {
      iVar1 = (**(code **)(*tensor->extra + 0x20))(tensor->extra,tensor,data,size);
      if (iVar1 == 0) {
        return;
      }
      pcVar3 = "OK == 0";
      uVar4 = 0x18c2;
    }
    else {
      pcVar3 = "size == ggml_nbytes(tensor)";
      uVar4 = 0x18bd;
    }
  }
  else {
    pcVar3 = "offset == 0";
    uVar4 = 0x18bc;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml-cpu/ggml-cpu-aarch64.cpp"
             ,uVar4,"GGML_ASSERT(%s) failed",pcVar3);
}

Assistant:

static void ggml_backend_cpu_aarch64_buffer_set_tensor(ggml_backend_buffer_t buffer, struct ggml_tensor * tensor,
                                                       const void * data, size_t offset, size_t size) {
    GGML_ASSERT(offset == 0);
    GGML_ASSERT(size == ggml_nbytes(tensor));

    auto tensor_traits = (ggml::cpu::aarch64::tensor_traits_base *) tensor->extra;
    auto OK            = tensor_traits->repack(tensor, data, size);

    GGML_ASSERT(OK == 0);
    GGML_UNUSED(buffer);
}